

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_StrCmp(char **pp1,char **pp2)

{
  char *p1_00;
  char *p2_00;
  int iVar1;
  bool bVar2;
  int local_34;
  int i;
  char *p2;
  char *p1;
  char **pp2_local;
  char **pp1_local;
  
  p1_00 = *pp1;
  p2_00 = *pp2;
  local_34 = 0;
  while( true ) {
    bVar2 = false;
    if (p1_00[local_34] != '\0') {
      bVar2 = p2_00[local_34] != '\0';
    }
    if (!bVar2) break;
    if (p1_00[local_34] != p2_00[local_34]) {
      iVar1 = Cba_StrCmpInt(p1_00,p2_00,local_34);
      return iVar1;
    }
    local_34 = local_34 + 1;
  }
  if ((p1_00[local_34] != '\0') && (p2_00[local_34] != '\0')) {
    __assert_fail("!p1[i] || !p2[i]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                  ,0x1a9,"int Cba_StrCmp(char **, char **)");
  }
  iVar1 = Cba_StrCmpInt(p1_00,p2_00,local_34);
  return iVar1;
}

Assistant:

int Cba_StrCmp( char ** pp1, char ** pp2 )
{
    char * p1 = *pp1;
    char * p2 = *pp2; int i;
    for ( i = 0; p1[i] && p2[i]; i++ )
        if ( p1[i] != p2[i] )
            return Cba_StrCmpInt( p1, p2, i );
    assert( !p1[i] || !p2[i] );
    return Cba_StrCmpInt( p1, p2, i );
}